

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O1

int __thiscall QAccessibleMenuBar::childCount(QAccessibleMenuBar *this)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  QList<QAction_*> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
  QWidget::actions(&local_28,this_00);
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (int)local_28.d.size;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMenuBar::childCount() const
{
    return menuBar()->actions().size();
}